

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

CurrentAndTwoMoreIter * __thiscall
cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter::advance
          (CurrentAndTwoMoreIter *__return_storage_ptr__,CurrentAndTwoMoreIter *this,base_t *args)

{
  _List_node_base *p_Var1;
  _List_iterator<cmExpandedCommandArgument> _Var2;
  
  _Var2 = std::next<std::_List_iterator<cmExpandedCommandArgument>>((this->current)._M_node,1);
  (this->current)._M_node = _Var2._M_node;
  _Var2 = std::next<std::_List_iterator<cmExpandedCommandArgument>>
                    (_Var2,(ulong)(_Var2._M_node != (_List_node_base *)args));
  (this->next)._M_node = _Var2._M_node;
  _Var2 = std::next<std::_List_iterator<cmExpandedCommandArgument>>
                    (_Var2,(ulong)(_Var2._M_node != (_List_node_base *)args));
  (this->nextnext)._M_node = _Var2._M_node;
  p_Var1 = (this->next)._M_node;
  (__return_storage_ptr__->current)._M_node = (this->current)._M_node;
  (__return_storage_ptr__->next)._M_node = p_Var1;
  (__return_storage_ptr__->nextnext)._M_node = _Var2._M_node;
  return __return_storage_ptr__;
}

Assistant:

CurrentAndTwoMoreIter advance(base_t& args)
    {
      this->current = std::next(this->current);
      this->next =
        std::next(this->current,
                  static_cast<difference_type>(this->current != args.end()));
      this->nextnext = std::next(
        this->next, static_cast<difference_type>(this->next != args.end()));
      return *this;
    }